

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

void * list_append(list *list,void *data)

{
  list_item *item;
  void *data_local;
  list *list_local;
  
  list_local = (list *)malloc(0x10);
  if (list_local == (list *)0x0) {
    list_local = (list *)0x0;
  }
  else {
    list_local->head = (list_item *)0x0;
    list_local->tail = (list_item *)data;
    if (list->head == (list_item *)0x0) {
      list->head = (list_item *)list_local;
    }
    else {
      list->tail->next = (list_item *)list_local;
    }
    list->tail = (list_item *)list_local;
  }
  return list_local;
}

Assistant:

void *list_append(struct list *list, void *data)
{
    struct list_item *item = malloc(sizeof(struct list_item));
    if (item == NULL) {
        return NULL;
    }
    item->next = NULL;
    item->data = data;
    if (list->head == NULL) {
        list->head = item;
    } else {
        list->tail->next = item;
    }
    list->tail = item;
    return item;
}